

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astTupleSlotNamedAtNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  anon_struct_48_6_72e9b287 gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *local_30;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrame.slotName = 0;
  gcFrame.slot = 0;
  gcFrame.analyzedNameExpression = 0;
  gcFrame.analyzedTupleExpressionType = 0;
  gcFrame.tupleSlotNamedAtNode = (sysbvm_astTupleSlotNamedAtNode_t *)0x0;
  gcFrame.analyzedTupleExpression = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 6;
  local_30 = (undefined1 *)&gcFrame;
  sysbvm_stackFrame_pushRecord(&local_48);
  gcFrame.tupleSlotNamedAtNode =
       (sysbvm_astTupleSlotNamedAtNode_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar2 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  ((gcFrame.tupleSlotNamedAtNode)->super).analyzerToken = sVar2;
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = ((gcFrame.tupleSlotNamedAtNode)->super).sourcePosition;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  gcFrame.analyzedTupleExpression =
       sysbvm_interpreter_analyzeASTWithReceiverTypeWithEnvironment
                 (context,(gcFrame.tupleSlotNamedAtNode)->tupleExpression,arguments[1]);
  (gcFrame.tupleSlotNamedAtNode)->tupleExpression = gcFrame.analyzedTupleExpression;
  gcFrame.analyzedNameExpression =
       sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                 (context,(gcFrame.tupleSlotNamedAtNode)->nameExpression,(context->roots).symbolType
                  ,arguments[1]);
  (gcFrame.tupleSlotNamedAtNode)->nameExpression = gcFrame.analyzedNameExpression;
  _Var1 = sysbvm_astNode_isLiteralNode(context,gcFrame.analyzedNameExpression);
  if (!_Var1) {
    sysbvm_error("Expected a literal slot name.");
  }
  gcFrame.slotName = sysbvm_astLiteralNode_getValue(gcFrame.analyzedNameExpression);
  if (gcFrame.analyzedTupleExpression == 0 || (gcFrame.analyzedTupleExpression & 0xf) != 0) {
    gcFrame.analyzedTupleExpressionType = 0;
  }
  else {
    gcFrame.analyzedTupleExpressionType =
         *(sysbvm_tuple_t *)(gcFrame.analyzedTupleExpression + 0x20);
    if (gcFrame.analyzedTupleExpressionType != 0) goto LAB_0011b667;
  }
  sysbvm_error_assertionFailure
            (
            "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/interpreter.c:4078: assertion failure: gcFrame.analyzedTupleExpressionType"
            );
LAB_0011b667:
  gcFrame.slot = sysbvm_type_lookupSlot
                           (context,gcFrame.analyzedTupleExpressionType,gcFrame.slotName);
  if (gcFrame.slot == 0) {
    sysbvm_error("Type does not have a slot with the specified name.");
  }
  (gcFrame.tupleSlotNamedAtNode)->boundSlot = gcFrame.slot;
  if ((gcFrame.slot == 0 || (gcFrame.slot & 0xf) != 0) ||
     (sVar2 = *(sysbvm_tuple_t *)(gcFrame.slot + 0x30),
     ((gcFrame.tupleSlotNamedAtNode)->super).analyzedType = sVar2, sVar2 == 0)) {
    ((gcFrame.tupleSlotNamedAtNode)->super).analyzedType = (context->roots).anyValueType;
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  sysbvm_stackFrame_popRecord(&local_48);
  return (sysbvm_tuple_t)gcFrame.tupleSlotNamedAtNode;
}

Assistant:

static sysbvm_tuple_t sysbvm_astTupleSlotNamedAtNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astTupleSlotNamedAtNode_t *tupleSlotNamedAtNode;
        sysbvm_tuple_t analyzedTupleExpression;
        sysbvm_tuple_t analyzedNameExpression;
        sysbvm_tuple_t analyzedTupleExpressionType;
        sysbvm_tuple_t slotName;
        sysbvm_tuple_t slot;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.tupleSlotNamedAtNode = (sysbvm_astTupleSlotNamedAtNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.tupleSlotNamedAtNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.tupleSlotNamedAtNode->super.sourcePosition);

    gcFrame.analyzedTupleExpression = sysbvm_interpreter_analyzeASTWithReceiverTypeWithEnvironment(context, gcFrame.tupleSlotNamedAtNode->tupleExpression, *environment);
    gcFrame.tupleSlotNamedAtNode->tupleExpression = gcFrame.analyzedTupleExpression;

    gcFrame.analyzedNameExpression = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.tupleSlotNamedAtNode->nameExpression, context->roots.symbolType, *environment);
    gcFrame.tupleSlotNamedAtNode->nameExpression = gcFrame.analyzedNameExpression;

    if(!sysbvm_astNode_isLiteralNode(context, gcFrame.analyzedNameExpression))
        sysbvm_error("Expected a literal slot name.");

    gcFrame.slotName = sysbvm_astLiteralNode_getValue(gcFrame.analyzedNameExpression);
    gcFrame.analyzedTupleExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedTupleExpression);
    SYSBVM_ASSERT(gcFrame.analyzedTupleExpressionType);

    gcFrame.slot = sysbvm_type_lookupSlot(context, gcFrame.analyzedTupleExpressionType, gcFrame.slotName);
    if(!gcFrame.slot)
        sysbvm_error("Type does not have a slot with the specified name.");

    gcFrame.tupleSlotNamedAtNode->boundSlot = gcFrame.slot;
    gcFrame.tupleSlotNamedAtNode->super.analyzedType = sysbvm_typeSlot_getType(gcFrame.slot);
    if(!gcFrame.tupleSlotNamedAtNode->super.analyzedType)
        gcFrame.tupleSlotNamedAtNode->super.analyzedType = context->roots.anyValueType;

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.tupleSlotNamedAtNode;
}